

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * trimStr(string *__return_storage_ptr__,string *value)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  
  pbVar2 = (byte *)(value->_M_dataplus)._M_p;
  pbVar1 = pbVar2 + (value->_M_string_length - 1);
  pbVar3 = pbVar2;
  if (pbVar2 < pbVar1) {
    lVar4 = value->_M_string_length - 1;
    do {
      pbVar3 = pbVar2;
      if ((0x20 < (ulong)*pbVar2) || ((0x100002400U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      pbVar2 = pbVar2 + 1;
      lVar4 = lVar4 + -1;
      pbVar3 = pbVar1;
    } while (lVar4 != 0);
  }
  while (((pbVar3 <= pbVar1 && ((ulong)*pbVar1 < 0x21)) &&
         ((0x100002400U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + -1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
  return __return_storage_ptr__;
}

Assistant:

string trimStr(const string& value)
{
    const char* bufStart = value.c_str();
    const char* bufEnd = bufStart + value.length() - 1;
    const char* chBeg = bufStart;
    const char* chEnd = bufEnd;
    for (; chBeg < bufEnd && (*chBeg == '\n' || *chBeg == '\r' || *chBeg == ' '); chBeg++)
        ;
    for (; chEnd >= chBeg && (*chEnd == '\n' || *chEnd == '\r' || *chEnd == ' '); chEnd--)
        ;
    return value.substr(chBeg - bufStart, chEnd - chBeg + 1);
}